

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Stream::maybeResumeUpload(QHttp2Stream *this)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  QHttp2Connection *pQVar4;
  long lVar5;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  uint in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  QHttp2Stream *in_stack_ffffffffffffff70;
  QSet<unsigned_int> *in_stack_ffffffffffffff78;
  QHttp2Stream *local_80;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  QHttp2Stream *this_00;
  
  this_00 = *(QHttp2Stream **)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  qHttp2ConnectionLog();
  anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar3) {
    anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b3061);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff64,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (char *)0x2b3077);
    pQVar4 = getConnection((QHttp2Stream *)0x2b3081);
    uVar1 = *(uint *)(in_RDI + 0x10);
    uVar2 = *(undefined8 *)(in_RDI + 0x38);
    if (*(long *)(in_RDI + 0x38) == 0) {
      local_80 = (QHttp2Stream *)0x0;
    }
    else {
      in_stack_ffffffffffffff78 =
           (QSet<unsigned_int> *)(**(code **)(**(long **)(in_RDI + 0x38) + 0x88))();
      lVar5 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x78))();
      local_80 = (QHttp2Stream *)((long)in_stack_ffffffffffffff78 - lVar5);
    }
    bVar3 = isUploadBlocked(local_80);
    in_stack_ffffffffffffff58 = (uint)bVar3;
    QMessageLogger::debug
              (local_38,
               "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? %d"
               ,pQVar4,(ulong)uVar1,uVar2,local_80);
    local_10 = local_10 & 0xffffffffffffff00;
    in_stack_ffffffffffffff70 = local_80;
  }
  bVar3 = isUploadingDATA(in_RDI);
  if ((!bVar3) || (bVar3 = isUploadBlocked(in_stack_ffffffffffffff70), bVar3)) {
    getConnection((QHttp2Stream *)0x2b316a);
    streamID(in_RDI);
    QSet<unsigned_int>::insert(in_stack_ffffffffffffff78,(uint *)in_stack_ffffffffffffff70);
  }
  else {
    internalSendDATA(this_00);
  }
  if (*(QHttp2Stream **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Stream::maybeResumeUpload()
{
    qCDebug(qHttp2ConnectionLog,
            "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? "
            "%d",
            getConnection(), m_streamID, m_uploadByteDevice,
            !m_uploadByteDevice ? 0 : m_uploadByteDevice->size() - m_uploadByteDevice->pos(),
            isUploadBlocked());
    if (isUploadingDATA() && !isUploadBlocked())
        internalSendDATA();
    else
        getConnection()->m_blockedStreams.insert(streamID());
}